

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# action_score.h
# Opt level: O3

int exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
              (float minimum_uniform,byte update_zero_elements,long pdf_first,long pdf_last)

{
  float fVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  
  uVar5 = *(ulong *)(pdf_first + 8);
  uVar4 = *(ulong *)(pdf_last + 8);
  iVar2 = 1;
  if (uVar5 <= uVar4 && uVar4 - uVar5 != 0) {
    uVar7 = (long)(uVar4 - uVar5) >> 3;
    if (0.999 < minimum_uniform) {
      uVar3 = uVar5;
      if (update_zero_elements == 0) {
        do {
          uVar7 = uVar7 - (-(uint)(*(float *)(uVar3 + 4) == 0.0) & 1);
          uVar3 = uVar3 + 8;
        } while (uVar3 != uVar4);
      }
      do {
        if ((update_zero_elements != 0) || (0.0 < *(float *)(uVar5 + 4))) {
          *(float *)(uVar5 + 4) = 1.0 / (float)uVar7;
          uVar4 = *(ulong *)(pdf_last + 8);
        }
        uVar5 = uVar5 + 8;
      } while (uVar5 != uVar4);
      return 0;
    }
    minimum_uniform = minimum_uniform / (float)uVar7;
    uVar6 = 0;
    fVar8 = 0.0;
    fVar9 = 0.0;
    do {
      fVar1 = *(float *)(uVar5 + 4);
      if (((fVar1 <= 0.0) && (fVar1 != 0.0 || (update_zero_elements ^ 1) != 0)) ||
         (minimum_uniform < fVar1)) {
        fVar8 = fVar8 + fVar1;
      }
      else {
        fVar9 = fVar9 + minimum_uniform;
        *(float *)(uVar5 + 4) = minimum_uniform;
        uVar6 = uVar6 + 1;
        uVar4 = *(ulong *)(pdf_last + 8);
      }
      uVar5 = uVar5 + 8;
    } while (uVar5 != uVar4);
    iVar2 = 0;
    if (0.0 < fVar9) {
      uVar5 = *(ulong *)(pdf_first + 8);
      if (fVar9 <= 0.999) {
        if (uVar5 != uVar4) {
          do {
            if (minimum_uniform < *(float *)(uVar5 + 4)) {
              *(float *)(uVar5 + 4) = *(float *)(uVar5 + 4) * ((1.0 - fVar9) / fVar8);
              uVar4 = *(ulong *)(pdf_last + 8);
            }
            uVar5 = uVar5 + 8;
          } while (uVar5 != uVar4);
        }
      }
      else if (uVar5 != uVar4) {
        fVar8 = (1.0 - fVar8) / (float)uVar6;
        do {
          fVar9 = *(float *)(uVar5 + 4);
          if (((0.0 < fVar9) || (fVar9 == 0.0 && (update_zero_elements ^ 1) == 0)) &&
             (fVar9 <= fVar8)) {
            *(float *)(uVar5 + 4) = fVar8;
            uVar4 = *(ulong *)(pdf_last + 8);
          }
          uVar5 = uVar5 + 8;
        } while (uVar5 != uVar4);
      }
    }
  }
  return iVar2;
}

Assistant:

bool operator!=(const score_iterator& other) const { return _p != other._p; }